

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O1

void duckdb::FunctionSerializer::Serialize<duckdb::TableFunction>
               (Serializer *serializer,TableFunction *function,
               optional_ptr<duckdb::FunctionData,_true> bind_info)

{
  table_function_serialize_t p_Var1;
  
  (*serializer->_vptr_Serializer[2])(serializer,500,"name");
  (*serializer->_vptr_Serializer[0x1c])
            (serializer,
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              name);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x1f5,"arguments");
  Serializer::WriteValue<duckdb::LogicalType>
            (serializer,
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x1f6,"original_arguments");
  Serializer::WriteValue<duckdb::LogicalType>
            (serializer,
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.original_arguments
            );
  (*serializer->_vptr_Serializer[3])(serializer);
  p_Var1 = function->serialize;
  (*serializer->_vptr_Serializer[2])(serializer,0x1f7,"has_serialize");
  (*serializer->_vptr_Serializer[0xe])
            (serializer,(ulong)(p_Var1 != (table_function_serialize_t)0x0));
  (*serializer->_vptr_Serializer[3])(serializer);
  if (p_Var1 != (table_function_serialize_t)0x0) {
    (*serializer->_vptr_Serializer[2])(serializer,0x1f8,"function_data");
    (*serializer->_vptr_Serializer[6])(serializer);
    (*function->serialize)(serializer,bind_info,function);
    (*serializer->_vptr_Serializer[7])(serializer);
    (*serializer->_vptr_Serializer[3])(serializer);
    return;
  }
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const FUNC &function, optional_ptr<FunctionData> bind_info) {
		D_ASSERT(!function.name.empty());
		serializer.WriteProperty(500, "name", function.name);
		serializer.WriteProperty(501, "arguments", function.arguments);
		serializer.WriteProperty(502, "original_arguments", function.original_arguments);
		bool has_serialize = function.serialize;
		serializer.WriteProperty(503, "has_serialize", has_serialize);
		if (has_serialize) {
			serializer.WriteObject(504, "function_data",
			                       [&](Serializer &obj) { function.serialize(obj, bind_info, function); });
			D_ASSERT(function.deserialize);
		}
	}